

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_mime_message_skeleton.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  CMimeMessage_T *message;
  void *pvStack_98;
  int option;
  char *out;
  char *file;
  char body [32];
  char subject [18];
  char local_47 [8];
  char to [15];
  char from [17];
  char **argv_local;
  int argc_local;
  
  builtin_strncpy(to + 7,"from@exa",8);
  builtin_strncpy(local_47,"to@examp",8);
  builtin_strncpy(to,"le.org",7);
  builtin_strncpy(body + 0x18,"this is ",8);
  file = (char *)0x72657620656d6f73;
  builtin_strncpy(body,"y interesting body line",0x18);
  out = (char *)0x0;
  pvStack_98 = (void *)0x0;
  while (iVar1 = getopt(argc,argv,"hf:"), iVar1 != -1) {
    if (iVar1 == 0x66) {
      asprintf(&out,"%s",_optarg);
    }
    else if (iVar1 == 0x68) {
      usage();
    }
    else {
      usage();
    }
  }
  uVar2 = cmime_message_create_skeleton(to + 7,local_47,body + 0x18);
  cmime_message_set_body(uVar2,&file);
  if (out == (char *)0x0) {
    pvStack_98 = (void *)cmime_message_to_string(uVar2);
    printf("%s\n",pvStack_98);
  }
  else {
    iVar1 = cmime_message_to_file(uVar2,out);
    if (iVar1 < 1) {
      printf("error writing file: %s\n",out);
    }
    else {
      printf("file created: %s\n",out);
    }
  }
  cmime_message_free(uVar2);
  if (out != (char *)0x0) {
    free(out);
  }
  if (pvStack_98 != (void *)0x0) {
    free(pvStack_98);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // addresses can either be specified "just as an address" or like "John Doe <from@example.org>"
    char from[] = "from@example.org";
    char to[] = "to@example.org";
    char subject[] = "this is a subject";
    char body[] = "some very interesting body line";
    char *file = NULL;
    char *out = NULL;
    int option;

    // initialization for new CMimeMessage_T object which is created by using cmime_message_create_skeleton
    CMimeMessage_T *message = NULL;

    // check command line parameters
    while((option = getopt(argc,argv,"hf:")) != EOF) {
        switch(option) {
            case 'f':
                asprintf(&file, "%s", optarg);
                break; 
            case 'h':
                usage();
                break; 
            default:
                usage();
        }
    }

    // create a basic skeletion with cmime_message_create_skeleton
    message = cmime_message_create_skeleton(from,to,subject);
    // add the body to object
    cmime_message_set_body(message,body);

    // assign the email to out or write it to file (depending on cli options)
    if(file != NULL) {
        if(cmime_message_to_file(message,file) > 0) {
            printf("file created: %s\n", file);
        } else {
            printf("error writing file: %s\n", file);
        }
    } else {
        out = cmime_message_to_string(message);
        printf("%s\n", out);
    }

    // free the initialized object
    cmime_message_free(message);

    // some clean up
    if(file != NULL)
        free(file);
    if(out != NULL)
        free(out);

    return (0);
}